

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_glib.cpp
# Opt level: O0

gboolean idleTimerSourcePrepare(GSource *source,gint *timeout)

{
  GTimerSource *in_RSI;
  gint *in_RDI;
  GTimerSource *timerSource;
  GIdleTimerSource *idleTimerSource;
  gboolean local_4;
  
  if ((*(byte *)(*(long *)(in_RDI + 0x18) + 0x8c) & 1) == 0) {
    if (in_RSI != (GTimerSource *)0x0) {
      *(undefined4 *)&(in_RSI->source).callback_data = 0xffffffff;
    }
    local_4 = 0;
  }
  else {
    local_4 = timerSourcePrepareHelper(in_RSI,in_RDI);
  }
  return local_4;
}

Assistant:

static gboolean idleTimerSourcePrepare(GSource *source, gint *timeout)
{
    GIdleTimerSource *idleTimerSource = reinterpret_cast<GIdleTimerSource *>(source);
    GTimerSource *timerSource = idleTimerSource->timerSource;
    if (!timerSource->runWithIdlePriority) {
        // Yield to the normal priority timer source
        if (timeout)
            *timeout = -1;
        return false;
    }

    return timerSourcePrepareHelper(timerSource, timeout);
}